

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::AdjustArgoutsForCallTargetInlining
          (Inline *this,Instr *callInstr,Instr **pExplicitThisArgOut,bool isCallInstanceFunction)

{
  code *pcVar1;
  anon_class_40_5_3f456024 callback;
  Instr *this_00;
  Instr **this_01;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  StackSym *pSVar8;
  Instr *pIVar9;
  Instr *this_02;
  Instr *this_03;
  IntConstOpnd *pIVar10;
  IntConstOpnd *pIVar11;
  long lVar12;
  Instr *local_b8;
  uint argsRemoved;
  Instr *bytecodeArgOutUse;
  Instr *bytecodeArgOutUse_1;
  Instr *functionArg;
  Instr *startCall;
  Opnd *linkOpnd;
  Instr *explicitThisArgOut;
  Instr *implicitThisArgOut;
  Instr *local_40;
  Instr *thirdArgOut;
  Instr *secondArgOut;
  Instr *firstArgOut;
  Instr **ppIStack_20;
  bool isCallInstanceFunction_local;
  Instr **pExplicitThisArgOut_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  firstArgOut._7_1_ = isCallInstanceFunction;
  ppIStack_20 = pExplicitThisArgOut;
  pExplicitThisArgOut_local = (Instr **)callInstr;
  callInstr_local = (Instr *)this;
  if (pExplicitThisArgOut == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd73,"(pExplicitThisArgOut)","pExplicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  secondArgOut = (Instr *)0x0;
  thirdArgOut = (Instr *)0x0;
  local_40 = (Instr *)0x0;
  callback.secondArgOut = &thirdArgOut;
  callback.thirdArgOut = &local_40;
  callback.firstArgOut = &secondArgOut;
  callback.this = this;
  callback.isCallInstanceFunction = (bool *)((long)&firstArgOut + 7);
  IR::Instr::
  IterateArgInstrs<Inline::AdjustArgoutsForCallTargetInlining(IR::Instr*,IR::Instr**,bool)::__0>
            ((Instr *)pExplicitThisArgOut_local,callback);
  this_00 = secondArgOut;
  if ((firstArgOut._7_1_ & 1) == 0) {
    local_b8 = thirdArgOut;
  }
  else {
    local_b8 = local_40;
  }
  if (local_b8 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd96,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Instr::HasByteCodeArgOutCapture(local_b8);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd97,"(explicitThisArgOut->HasByteCodeArgOutCapture())",
                       "explicitThisArgOut->HasByteCodeArgOutCapture()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::GetSrc2(this_00);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
  if (bVar2) {
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
    pSVar8 = IR::Opnd::GetStackSym(&pRVar7->super_Opnd);
    bVar2 = StackSym::IsSingleDef(pSVar8);
    if (bVar2) goto LAB_007222c8;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                     ,0xd9b,
                     "(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef())"
                     ,"linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef()"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_007222c8:
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pSVar8 = IR::Opnd::GetStackSym(&pRVar7->super_Opnd);
  pIVar9 = StackSym::GetInstrDef(pSVar8);
  if (pIVar9->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9c,
                       "(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                       ,
                       "linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pSVar8 = IR::Opnd::GetStackSym(&pRVar7->super_Opnd);
  this_02 = StackSym::GetInstrDef(pSVar8);
  pOVar6 = IR::Instr::GetDst(this_02);
  IR::Instr::ReplaceSrc2(local_b8,pOVar6);
  pIVar9 = thirdArgOut;
  *ppIStack_20 = local_b8;
  if ((firstArgOut._7_1_ & 1) != 0) {
    this_03 = IR::Instr::New(BytecodeArgOutUse,(Func *)pExplicitThisArgOut_local[4],
                             (Instr *)pExplicitThisArgOut_local);
    this_01 = pExplicitThisArgOut_local;
    pOVar6 = IR::Instr::GetSrc1(pIVar9);
    IR::Instr::ReplaceSrc1((Instr *)this_01,pOVar6);
    pOVar6 = IR::Instr::GetSrc1(pIVar9);
    IR::Instr::SetSrc1(this_03,pOVar6);
    IR::Instr::InsertBefore((Instr *)pExplicitThisArgOut_local,this_03);
    IR::Instr::Remove(pIVar9);
  }
  pIVar9 = IR::Instr::New(BytecodeArgOutUse,(Func *)pExplicitThisArgOut_local[4],
                          (Instr *)pExplicitThisArgOut_local);
  pOVar6 = IR::Instr::GetSrc1(this_00);
  IR::Instr::SetSrc1(pIVar9,pOVar6);
  IR::Instr::InsertBefore((Instr *)pExplicitThisArgOut_local,pIVar9);
  IR::Instr::Remove(this_00);
  uVar3 = IR::Instr::GetArgOutCount(this_02,false);
  pIVar10 = IR::IntConstOpnd::New((ulong)uVar3,TyUint32,this_02->m_func,false);
  IR::Instr::SetSrc2(this_02,&pIVar10->super_Opnd);
  uVar4 = 1;
  if ((firstArgOut._7_1_ & 1) != 0) {
    uVar4 = 2;
  }
  pOVar6 = IR::Instr::GetSrc1(this_02);
  pIVar10 = IR::Opnd::AsIntConstOpnd(pOVar6);
  pOVar6 = IR::Instr::GetSrc1(this_02);
  pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar6);
  lVar12 = IR::EncodableOpnd<long>::GetValue(&pIVar11->super_EncodableOpnd<long>);
  IR::IntConstOpnd::SetValue(pIVar10,lVar12 - (ulong)uVar4);
  return;
}

Assistant:

void
Inline::AdjustArgoutsForCallTargetInlining(IR::Instr* callInstr, IR::Instr ** pExplicitThisArgOut, bool isCallInstanceFunction)
{
    Assert(pExplicitThisArgOut);

    IR::Instr * firstArgOut = nullptr;
    IR::Instr * secondArgOut = nullptr;
    IR::Instr * thirdArgOut = nullptr;

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        thirdArgOut = secondArgOut;
        secondArgOut = firstArgOut;
        firstArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" argout (which will be removed) as well,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.

        StackSym * argSym = argInstr->GetDst()->AsSymOpnd()->GetStackSym();
        
        Assert(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr);
        argSym->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        if (argSym->GetArgSlotNum() != 0)
        {
            this->topFunc->SetArgOffset(argSym, argSym->m_offset - MachPtr);
        }

        if (isCallInstanceFunction && argSym->GetArgSlotNum() != 0)
        {
            argSym->DecrementArgSlotNum(); // We will also be removing the function argout
        }

        return false;
    });

    IR::Instr * implicitThisArgOut = firstArgOut;
    IR::Instr * explicitThisArgOut = isCallInstanceFunction ? thirdArgOut : secondArgOut;

    Assert(explicitThisArgOut);
    Assert(explicitThisArgOut->HasByteCodeArgOutCapture());


    IR::Opnd* linkOpnd = implicitThisArgOut->GetSrc2();
    Assert(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef());
    Assert(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall);

    IR::Instr* startCall = linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef();

    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    *pExplicitThisArgOut = explicitThisArgOut;

    if (isCallInstanceFunction)
    {
        IR::Instr * functionArg = secondArgOut;
        IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
        callInstr->ReplaceSrc1(functionArg->GetSrc1());
        bytecodeArgOutUse->SetSrc1(functionArg->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the function argout live till the call instruction for it to be captured by any bailout in the call sequence.
        functionArg->Remove();
    }

    IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
    bytecodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the implicit "this" argout live till the call instruction for it to be captured by any bailout in the call sequence.
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));

    uint argsRemoved = isCallInstanceFunction ? 2 : 1;
    startCall->GetSrc1()->AsIntConstOpnd()->SetValue(startCall->GetSrc1()->AsIntConstOpnd()->GetValue() - argsRemoved);
}